

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O3

result<toml::detail::region,_toml::detail::none_t> *
toml::detail::
repeat<toml::detail::either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>,_toml::detail::at_least<1UL>_>
::invoke(result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,location *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  const_iterator rollback;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  size_type sVar6;
  bool bVar7;
  value_type *pvVar8;
  region retval;
  result<toml::detail::region,_toml::detail::none_t> rslt;
  region local_110;
  result<toml::detail::region,_toml::detail::none_t> local_c8;
  region local_78;
  
  region::region(&local_110,loc);
  rollback._M_current = (loc->iter_)._M_current;
  either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>::invoke(&local_c8,loc);
  bVar7 = local_c8.is_ok_;
  if (local_c8.is_ok_ == false) {
    location::reset(loc,rollback);
    __return_storage_ptr__->is_ok_ = false;
  }
  else {
    pvVar8 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&local_c8);
    if ((local_110.source_.
         super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr !=
         (pvVar8->source_).
         super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr) || (local_110.last_._M_current != (pvVar8->first_)._M_current)) {
LAB_001272a9:
      __assert_fail("this->source_ == other.source_ && this->last_ == other.first_",
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/toml11/toml/region.hpp"
                    ,0xe6,"region &toml::detail::region::operator+=(const region &)");
    }
    local_110.last_._M_current = (pvVar8->last_)._M_current;
  }
  if (local_c8.is_ok_ == true) {
    region::~region(&local_c8.field_1.succ.value);
  }
  if (bVar7 != false) {
    paVar3 = &local_78.source_name_.field_2;
    paVar2 = &local_110.source_name_.field_2;
    paVar1 = &(__return_storage_ptr__->field_1).succ.value.source_name_.field_2;
    do {
      either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>::invoke(&local_c8,loc);
      bVar7 = local_c8.is_ok_;
      sVar6 = local_110.source_name_._M_string_length;
      _Var5._M_pi = local_110.source_.
                    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      peVar4 = local_110.source_.
               super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      if (local_c8.is_ok_ == false) {
        local_78.super_region_base._vptr_region_base = (_func_int **)&PTR__region_001d4f90;
        local_110.source_.
        super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_110.source_.
        super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110.source_name_._M_dataplus._M_p == paVar2) {
          local_78.source_name_.field_2._8_8_ = local_110.source_name_.field_2._8_8_;
          local_110.source_name_._M_dataplus._M_p = (pointer)paVar3;
        }
        local_78.source_name_.field_2._M_allocated_capacity._1_7_ =
             local_110.source_name_.field_2._M_allocated_capacity._1_7_;
        local_78.source_name_.field_2._M_local_buf[0] =
             local_110.source_name_.field_2._M_local_buf[0];
        local_110.source_name_._M_string_length = 0;
        local_110.source_name_.field_2._M_local_buf[0] = '\0';
        local_78.first_._M_current._0_4_ = local_110.first_._M_current._0_4_;
        local_78.first_._M_current._4_4_ = local_110.first_._M_current._4_4_;
        local_78.last_._M_current._0_4_ = local_110.last_._M_current._0_4_;
        local_78.last_._M_current._4_4_ = local_110.last_._M_current._4_4_;
        __return_storage_ptr__->is_ok_ = true;
        (__return_storage_ptr__->field_1).succ.value.super_region_base._vptr_region_base =
             (_func_int **)&PTR__region_001d4f90;
        local_78.source_.
        super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (__return_storage_ptr__->field_1).succ.value.source_.
        super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = peVar4;
        (__return_storage_ptr__->field_1).succ.value.source_.
        super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = _Var5._M_pi;
        local_78.source_.
        super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)((long)&__return_storage_ptr__->field_1 + 0x18) = paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110.source_name_._M_dataplus._M_p == paVar3) {
          paVar1->_M_allocated_capacity = local_78.source_name_.field_2._M_allocated_capacity;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->field_1).succ.value.source_name_.field_2 + 8) =
               local_78.source_name_.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->field_1).succ.value.source_name_._M_dataplus._M_p =
               local_110.source_name_._M_dataplus._M_p;
          (__return_storage_ptr__->field_1).succ.value.source_name_.field_2._M_allocated_capacity =
               local_78.source_name_.field_2._M_allocated_capacity;
        }
        (__return_storage_ptr__->field_1).succ.value.source_name_._M_string_length = sVar6;
        local_78.source_name_._M_string_length = 0;
        local_78.source_name_.field_2._M_allocated_capacity =
             (ulong)(uint7)local_110.source_name_.field_2._M_allocated_capacity._1_7_ << 8;
        (__return_storage_ptr__->field_1).succ.value.first_._M_current =
             (char *)CONCAT44(local_110.first_._M_current._4_4_,local_110.first_._M_current._0_4_);
        *(char **)((long)&__return_storage_ptr__->field_1 + 0x40) = local_110.last_._M_current;
        local_110.source_name_._M_dataplus._M_p = (pointer)paVar2;
        local_78.source_name_._M_dataplus._M_p = (pointer)paVar3;
        region::~region(&local_78);
      }
      else {
        pvVar8 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&local_c8);
        if ((local_110.source_.
             super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr !=
             (pvVar8->source_).
             super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr) || (local_110.last_._M_current != (pvVar8->first_)._M_current))
        goto LAB_001272a9;
        local_110.last_._M_current = (pvVar8->last_)._M_current;
      }
      if (local_c8.is_ok_ == true) {
        region::~region(&local_c8.field_1.succ.value);
      }
    } while (bVar7 != false);
  }
  region::~region(&local_110);
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc)
    {
        region retval(loc);

        const auto first = loc.iter();
        for(std::size_t i=0; i<N; ++i)
        {
            auto rslt = T::invoke(loc);
            if(rslt.is_err())
            {
                loc.reset(first);
                return none();
            }
            retval += rslt.unwrap();
        }
        while(true)
        {
            auto rslt = T::invoke(loc);
            if(rslt.is_err())
            {
                return ok(std::move(retval));
            }
            retval += rslt.unwrap();
        }
    }